

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O2

void __thiscall iDynTree::AccelerometerSensor::AccelerometerSensor(AccelerometerSensor *this)

{
  AccelerometerPrivateAttributes *pAVar1;
  Transform aTStack_78 [96];
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__AccelerometerSensor_001e6978;
  pAVar1 = (AccelerometerPrivateAttributes *)operator_new(0xa8);
  AccelerometerPrivateAttributes::AccelerometerPrivateAttributes(pAVar1);
  this->pimpl = pAVar1;
  std::__cxx11::string::assign((char *)pAVar1);
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=(&this->pimpl->link_H_sensor,aTStack_78);
  pAVar1 = this->pimpl;
  pAVar1->parent_link_index = -1;
  std::__cxx11::string::assign((char *)&pAVar1->parent_link_name);
  return;
}

Assistant:

AccelerometerSensor::AccelerometerSensor()
{
    this->pimpl = new AccelerometerPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link_H_sensor = Transform::Identity();
    this->pimpl->parent_link_index = -1;
    this->pimpl->parent_link_name = "";

}